

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlregexp.c
# Opt level: O0

int xmlRegStrEqualWildcard(xmlChar *expStr,xmlChar *valStr)

{
  xmlChar *pxVar1;
  xmlChar *tmp;
  xmlChar *valStr_local;
  xmlChar *expStr_local;
  
  if (expStr == valStr) {
    expStr_local._4_4_ = 1;
  }
  else if (expStr == (xmlChar *)0x0) {
    expStr_local._4_4_ = 0;
  }
  else {
    tmp = valStr;
    valStr_local = expStr;
    if (valStr == (xmlChar *)0x0) {
      expStr_local._4_4_ = 0;
    }
    else {
      do {
        pxVar1 = tmp;
        if (*valStr_local == *tmp) {
          tmp = tmp + 1;
        }
        else {
          if (*tmp == '*') {
            tmp = valStr_local;
            valStr_local = pxVar1;
          }
          if (((*tmp == '\0') || (*valStr_local == '\0')) || (*valStr_local != '*')) {
            return 0;
          }
          do {
            if (*tmp == '|') break;
            tmp = tmp + 1;
          } while (*tmp != '\0');
        }
        valStr_local = valStr_local + 1;
      } while (*tmp != '\0');
      if (*valStr_local == '\0') {
        expStr_local._4_4_ = 1;
      }
      else {
        expStr_local._4_4_ = 0;
      }
    }
  }
  return expStr_local._4_4_;
}

Assistant:

static int
xmlRegStrEqualWildcard(const xmlChar *expStr, const xmlChar *valStr) {
    if (expStr == valStr) return(1);
    if (expStr == NULL) return(0);
    if (valStr == NULL) return(0);
    do {
	/*
	* Eval if we have a wildcard for the current item.
	*/
        if (*expStr != *valStr) {
	    /* if one of them starts with a wildcard make valStr be it */
	    if (*valStr == '*') {
	        const xmlChar *tmp;

		tmp = valStr;
		valStr = expStr;
		expStr = tmp;
	    }
	    if ((*valStr != 0) && (*expStr != 0) && (*expStr++ == '*')) {
		do {
		    if (*valStr == XML_REG_STRING_SEPARATOR)
			break;
		    valStr++;
		} while (*valStr != 0);
		continue;
	    } else
		return(0);
	}
	expStr++;
	valStr++;
    } while (*valStr != 0);
    if (*expStr != 0)
	return (0);
    else
	return (1);
}